

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaLoader::BuildLightsForNode
          (ColladaLoader *this,ColladaParser *pParser,Node *pNode,aiNode *pTarget)

{
  pointer *pppaVar1;
  uint uVar2;
  key_type *pkVar3;
  iterator __position;
  const_iterator cVar4;
  aiNode *paVar5;
  Logger *this_00;
  key_type *__k;
  float __tmp;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  aiLight *out;
  char *local_1c8;
  char local_1b8 [16];
  aiNode *local_1a8 [14];
  ios_base local_138 [264];
  
  __k = &((pNode->mLights).
          super__Vector_base<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>
          ._M_impl.super__Vector_impl_data._M_start)->mLight;
  pkVar3 = &((pNode->mLights).
             super__Vector_base<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>
             ._M_impl.super__Vector_impl_data._M_finish)->mLight;
  if (__k != pkVar3) {
    do {
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>_>_>
              ::find(&(pParser->mLightLibrary)._M_t,__k);
      if ((_Rb_tree_header *)cVar4._M_node ==
          &(pParser->mLightLibrary)._M_t._M_impl.super__Rb_tree_header) {
        this_00 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[39]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [39])"Collada: Unable to find light for ID \"");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\". Skipping.",0xc)
        ;
        std::__cxx11::stringbuf::str();
        Logger::warn(this_00,local_1c8);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        paVar5 = (aiNode *)operator_new(0x46c);
        (paVar5->mName).length = 0;
        (paVar5->mName).data[0] = '\0';
        memset((paVar5->mName).data + 1,0x1b,0x3ff);
        (paVar5->mTransformation).a1 = 0.0;
        (paVar5->mTransformation).a2 = 0.0;
        *(undefined8 *)&(paVar5->mTransformation).a3 = 0;
        (paVar5->mTransformation).b1 = 0.0;
        (paVar5->mTransformation).b2 = 0.0;
        *(undefined8 *)&(paVar5->mTransformation).b3 = 0;
        (paVar5->mTransformation).b4 = 0.0;
        (paVar5->mTransformation).c1 = 0.0;
        *(undefined8 *)&(paVar5->mTransformation).c2 = 0;
        (paVar5->mTransformation).c4 = 1.0;
        *(undefined8 *)&(paVar5->mTransformation).d1 = 0;
        *(undefined8 *)&(paVar5->mTransformation).d3 = 0;
        *(ai_real *)&paVar5->field_0x444 = 0.0;
        *(ai_real *)&paVar5->mParent = 0.0;
        *(undefined8 *)((long)&paVar5->mParent + 4) = 0;
        *(undefined8 *)&paVar5->field_0x454 = 0;
        *(undefined8 *)((long)&paVar5->mChildren + 4) = 0x40c90fdb40c90fdb;
        *(float *)&paVar5->field_0x464 = 0.0;
        *(float *)&paVar5->mMeshes = 0.0;
        local_1a8[0] = paVar5;
        if (paVar5 != pTarget) {
          uVar2 = (pTarget->mName).length;
          (paVar5->mName).length = uVar2;
          memcpy((paVar5->mName).data,(pTarget->mName).data,(ulong)uVar2);
          (paVar5->mName).data[uVar2] = '\0';
        }
        fVar8 = (float)cVar4._M_node[2]._M_color;
        (paVar5->mTransformation).a1 = fVar8;
        (paVar5->mTransformation).b1 = 0.0;
        (paVar5->mTransformation).b2 = 0.0;
        (paVar5->mTransformation).b3 = -1.0;
        (paVar5->mTransformation).c3 = *(float *)&cVar4._M_node[2]._M_left;
        (paVar5->mTransformation).c4 = *(float *)((long)&cVar4._M_node[2]._M_left + 4);
        (paVar5->mTransformation).d1 = *(float *)&cVar4._M_node[2]._M_right;
        fVar6 = *(float *)((long)&cVar4._M_node[3]._M_parent + 4);
        fVar7 = *(float *)&cVar4._M_node[2].field_0x4 * fVar6;
        fVar9 = *(float *)&cVar4._M_node[2]._M_parent * fVar6;
        fVar6 = fVar6 * *(float *)((long)&cVar4._M_node[2]._M_parent + 4);
        ((aiColor3D *)&paVar5->mNumChildren)->r = fVar7;
        *(float *)&paVar5->field_0x454 = fVar9;
        *(float *)&paVar5->mChildren = fVar6;
        ((aiColor3D *)&paVar5->field_0x444)->r = fVar7;
        *(float *)&paVar5->mParent = fVar9;
        *(float *)((long)&paVar5->mParent + 4) = fVar6;
        ((aiColor3D *)&(paVar5->mTransformation).d2)->r = fVar7;
        (paVar5->mTransformation).d3 = fVar9;
        (paVar5->mTransformation).d4 = fVar6;
        if (fVar8 == 5.60519e-45) {
          (paVar5->mTransformation).d2 = 0.0;
          (paVar5->mTransformation).d3 = 0.0;
          *(undefined8 *)&(paVar5->mTransformation).d4 = 0;
          paVar5->mParent = (aiNode *)0x0;
          fVar6 = *(float *)((long)&cVar4._M_node[3]._M_parent + 4);
          fVar8 = *(float *)((long)&cVar4._M_node[2]._M_parent + 4);
          fVar7 = *(float *)&cVar4._M_node[2]._M_parent;
          paVar5->mNumChildren = (uint)(fVar6 * *(float *)&cVar4._M_node[2].field_0x4);
          *(float *)&paVar5->field_0x454 = fVar7 * fVar6;
          *(float *)&paVar5->mChildren = fVar8 * fVar6;
        }
        else {
          fVar6 = *(float *)((long)&cVar4._M_node[3]._M_parent + 4);
          fVar7 = *(float *)&cVar4._M_node[2].field_0x4 * fVar6;
          fVar9 = *(float *)&cVar4._M_node[2]._M_parent * fVar6;
          fVar6 = fVar6 * *(float *)((long)&cVar4._M_node[2]._M_parent + 4);
          ((aiColor3D *)&paVar5->field_0x444)->r = fVar7;
          *(float *)&paVar5->mParent = fVar9;
          *(float *)((long)&paVar5->mParent + 4) = fVar6;
          ((aiColor3D *)&(paVar5->mTransformation).d2)->r = fVar7;
          (paVar5->mTransformation).d3 = fVar9;
          (paVar5->mTransformation).d4 = fVar6;
          paVar5->mNumChildren = 0;
          *(ai_real *)&paVar5->field_0x454 = 0.0;
          *(ai_real *)&paVar5->mChildren = 0.0;
          if (fVar8 == 4.2039e-45) {
            fVar6 = *(float *)((long)&cVar4._M_node[2]._M_right + 4) * 0.017453292;
            *(float *)((long)&paVar5->mChildren + 4) = fVar6;
            if (9.99999e+08 <= *(float *)&cVar4._M_node[3]._M_parent) {
              if (9.99999e+08 <= *(float *)&cVar4._M_node[3].field_0x4) {
                fVar6 = powf(0.1,1.0 / (float)cVar4._M_node[3]._M_color);
                fVar6 = acosf(fVar6);
                fVar6 = fVar6 + *(float *)((long)&local_1a8[0]->mChildren + 4);
                paVar5 = local_1a8[0];
              }
              else {
                fVar8 = *(float *)&cVar4._M_node[3].field_0x4 * 0.017453292 + fVar6;
                paVar5->mNumMeshes = (uint)fVar8;
                if (fVar6 <= fVar8) goto LAB_003faa53;
                *(float *)((long)&paVar5->mChildren + 4) = fVar8;
              }
              paVar5->mNumMeshes = (uint)fVar6;
            }
            else {
              paVar5->mNumMeshes = (uint)(*(float *)&cVar4._M_node[3]._M_parent * 0.017453292);
            }
          }
        }
LAB_003faa53:
        __position._M_current =
             (this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*const&>
                    ((vector<aiLight*,std::allocator<aiLight*>> *)&this->mLights,__position,
                     (aiLight **)local_1a8);
        }
        else {
          *__position._M_current = (aiLight *)paVar5;
          pppaVar1 = &(this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppaVar1 = *pppaVar1 + 1;
        }
      }
      __k = __k + 1;
    } while (__k != pkVar3);
  }
  return;
}

Assistant:

void ColladaLoader::StoreAnimations(aiScene* pScene, const ColladaParser& pParser, const Collada::Animation* pSrcAnim, const std::string &pPrefix)
{
    std::string animName = pPrefix.empty() ? pSrcAnim->mName : pPrefix + "_" + pSrcAnim->mName;

    // create nested animations, if given
    for (std::vector<Collada::Animation*>::const_iterator it = pSrcAnim->mSubAnims.begin(); it != pSrcAnim->mSubAnims.end(); ++it)
        StoreAnimations(pScene, pParser, *it, animName);

    // create animation channels, if any
    if (!pSrcAnim->mChannels.empty())
        CreateAnimation(pScene, pParser, pSrcAnim, animName);
}